

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall llvm::cl::Option::addArgument(Option *this)

{
  CommandLineParser *this_00;
  SubCommand *pSVar1;
  void **ppvVar2;
  SmallPtrSetIteratorImpl SVar3;
  iterator iVar4;
  SmallPtrSetIteratorImpl local_38;
  
  this_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                          *)this);
  if ((this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumNonEmpty ==
      (this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.super_SmallPtrSetImplBase.
      NumTombstones) {
    pSVar1 = ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)TopLevelSubCommand);
    anon_unknown.dwarf_23af3b::CommandLineParser::addOption(this_00,this,pSVar1);
  }
  else {
    SVar3 = (SmallPtrSetIteratorImpl)
            SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                      (&(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    local_38 = SVar3;
    iVar4 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                      (&(this->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
    ppvVar2 = SVar3.Bucket;
    while (ppvVar2 != iVar4.super_SmallPtrSetIteratorImpl.Bucket) {
      pSVar1 = SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                         ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      anon_unknown.dwarf_23af3b::CommandLineParser::addOption(this_00,this,pSVar1);
      SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
      ppvVar2 = local_38.Bucket;
    }
  }
  this->FullyInitialized = true;
  return;
}

Assistant:

void Option::addArgument() {
  GlobalParser->addOption(this);
  FullyInitialized = true;
}